

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_expr.cpp
# Opt level: O2

FProduction * ParseExpression(FCommandLine *argv,int *parsept)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  byte *str;
  FProduction *block;
  FDoubleProd *pFVar6;
  FStringProd *pFVar7;
  FDoubleProd *pFVar8;
  long lVar9;
  double val;
  FProduction *local_40;
  FDoubleProd *local_38;
  
  iVar4 = *parsept;
  iVar3 = FCommandLine::argc(argv);
  if (iVar4 < iVar3) {
    iVar4 = *parsept;
    *parsept = iVar4 + 1;
    str = (byte *)FCommandLine::operator[](argv,iVar4);
    bVar2 = IsFloat((char *)str);
    if (bVar2) {
      val = atof((char *)str);
    }
    else {
      iVar4 = strcasecmp((char *)str,"true");
      if (iVar4 == 0) {
        val = 1.0;
      }
      else {
        iVar4 = strcasecmp((char *)str,"false");
        if (iVar4 != 0) {
          lVar1 = 0;
          do {
            lVar9 = lVar1;
            if (lVar9 + 0x18 == 0x1e0) {
              uVar5 = *str - 0x21;
              if (uVar5 == 0) {
                uVar5 = (uint)str[1];
              }
              if (uVar5 != 0) {
                pFVar7 = NewStringProd((char *)str);
                return &pFVar7->super_FProduction;
              }
              pFVar6 = (FDoubleProd *)ParseExpression(argv,parsept);
              if (pFVar6 == (FDoubleProd *)0x0) {
                pFVar6 = (FDoubleProd *)0x0;
                block = (FProduction *)0x0;
                goto LAB_00377d86;
              }
              if ((pFVar6->super_FProduction).Type == PROD_String) {
                pFVar6 = StringToDouble((FProduction *)pFVar6);
              }
              pFVar8 = NewDoubleProd((double)(-(ulong)(pFVar6->Value == 0.0) & 0x3ff0000000000000));
              goto LAB_00377df1;
            }
            iVar4 = strcmp(Producers[0].Token + lVar9,(char *)str);
            lVar1 = lVar9 + 0x18;
          } while (iVar4 != 0);
          pFVar6 = (FDoubleProd *)ParseExpression(argv,parsept);
          local_38 = pFVar6;
          block = ParseExpression(argv,parsept);
          local_40 = block;
          if (block == (FProduction *)0x0 || pFVar6 == (FDoubleProd *)0x0) {
LAB_00377d86:
            pFVar8 = (FDoubleProd *)0x0;
            Printf("Missing argument to %s\n",str);
          }
          else {
            if (*(long *)(Producers[0].Token + lVar9 + 0x10) == 0) {
              DoubleCoerce((FProduction **)&local_38,&local_40);
            }
            else if (*(long *)(Producers[0].Token + lVar9 + 8) == 0) {
              MustStringCoerce((FProduction **)&local_38,&local_40);
            }
            else {
              MaybeStringCoerce((FProduction **)&local_38,&local_40);
            }
            pFVar6 = local_38;
            block = local_40;
            if ((local_38->super_FProduction).Type == PROD_String) {
              pFVar8 = (FDoubleProd *)
                       (**(code **)(Producers[0].Token + lVar9 + 0x10))(local_38,local_40);
            }
            else {
              pFVar8 = (FDoubleProd *)
                       (**(code **)(Producers[0].Token + lVar9 + 8))(local_38,local_40);
            }
          }
          if (block != (FProduction *)0x0) {
            M_Free(block);
          }
          if (pFVar6 == (FDoubleProd *)0x0) {
            return &pFVar8->super_FProduction;
          }
LAB_00377df1:
          M_Free(pFVar6);
          return &pFVar8->super_FProduction;
        }
        val = 0.0;
      }
    }
    pFVar6 = NewDoubleProd(val);
  }
  else {
    pFVar6 = (FDoubleProd *)0x0;
  }
  return &pFVar6->super_FProduction;
}

Assistant:

static FProduction *ParseExpression (FCommandLine &argv, int &parsept)
{
	if (parsept >= argv.argc())
		return NULL;

	const char *token = argv[parsept++];
	FProduction *prod1 = NULL, *prod2 = NULL, *prod3 = NULL;

	if (IsFloat (token))
	{
		return NewDoubleProd (atof(token));
	}
	else if (stricmp (token, "true") == 0)
	{
		return NewDoubleProd (1.0);
	}
	else if (stricmp (token, "false") == 0)
	{
		return NewDoubleProd (0.0);
	}
	else
	{
		for (size_t i = 0; i < countof(Producers); ++i)
		{
			if (strcmp (Producers[i].Token, token) == 0)
			{
				prod1 = ParseExpression (argv, parsept);
				prod2 = ParseExpression (argv, parsept);
				if (prod1 == NULL || prod2 == NULL)
				{
					goto missing;
				}
				if (Producers[i].StringProducer == NULL)
				{
					DoubleCoerce (prod1, prod2);
				}
				else if (Producers[i].DoubleProducer == NULL)
				{
					MustStringCoerce (prod1, prod2);
				}
				else
				{
					MaybeStringCoerce (prod1, prod2);
				}
				if (prod1->Type == PROD_String)
				{
					prod3 = Producers[i].StringProducer ((FStringProd *)prod1, (FStringProd *)prod2);
				}
				else
				{
					prod3 = Producers[i].DoubleProducer ((FDoubleProd *)prod1, (FDoubleProd *)prod2);
				}
				goto done;
			}
		}
		if (strcmp ("!", token) == 0)
		{
			prod1 = ParseExpression (argv, parsept);
			if (prod1 == NULL)
			{
				goto missing;
			}
			if (prod1->Type == PROD_String)
			{
				prod1 = StringToDouble (prod1);
			}
			prod3 = NewDoubleProd (!static_cast<FDoubleProd *>(prod1)->Value);
			goto done;
		}
		return NewStringProd (token);
	}

missing:
	Printf ("Missing argument to %s\n", token);

done:
	if (prod2 != NULL) M_Free (prod2);
	if (prod1 != NULL) M_Free (prod1);
	return prod3;
}